

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O1

void Nf_ManElaBestMatch(Nf_Man_t *p,int iObj,int c,Nf_Mat_t *pRes,int Required)

{
  uint *pCutSet;
  uint uVar1;
  void *pvVar2;
  ulong uVar3;
  uint uVar4;
  uint *puVar5;
  int iVar6;
  
  if ((iObj < 0) || ((p->vCutSets).nSize <= iObj)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  uVar1 = (p->vCutSets).pArray[(uint)iObj];
  uVar4 = (int)uVar1 >> 0x10;
  if ((-1 < (int)uVar4) && ((int)uVar4 < (p->vPages).nSize)) {
    pvVar2 = (p->vPages).pArray[uVar4];
    uVar3 = (ulong)(uVar1 & 0xffff);
    *(undefined8 *)pRes = 0;
    pRes->D = 0;
    pRes->F = 0.0;
    pRes->D = 0x3fffffff;
    pRes->F = 3.4028235e+38;
    if (0 < *(int *)((long)pvVar2 + uVar3 * 4)) {
      pCutSet = (uint *)((long)pvVar2 + uVar3 * 4);
      iVar6 = 0;
      puVar5 = pCutSet;
      do {
        puVar5 = puVar5 + 1;
        if ((int)(*puVar5 >> 6) < p->vTt2Match->nSize) {
          Nf_ManElaBestMatchOne(p,iObj,c,(int *)puVar5,(int *)pCutSet,pRes,Required);
        }
        iVar6 = iVar6 + 1;
        puVar5 = puVar5 + (*puVar5 & 0x1f);
      } while (iVar6 < (int)*pCutSet);
    }
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Nf_ManElaBestMatch( Nf_Man_t * p, int iObj, int c, Nf_Mat_t * pRes, int Required )
{
    int k, * pCut, * pCutSet = Nf_ObjCutSet( p, iObj );
    memset( pRes, 0, sizeof(Nf_Mat_t) );
    pRes->D = SCL_INFINITY; pRes->F = FLT_MAX;
    Nf_SetForEachCut( pCutSet, pCut, k )
    {
        if ( Abc_Lit2Var(Nf_CutFunc(pCut)) >= Vec_WecSize(p->vTt2Match) )
            continue;
        Nf_ManElaBestMatchOne( p, iObj, c, pCut, pCutSet, pRes, Required );
    }
}